

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<int_const&,bool_const&,bool_const&,bool_const&,pbrt::LightSampler_const&>
               (string *s,char *fmt,int *v,bool *args,bool *args_1,bool *args_2,LightSampler *args_3
               )

{
  long lVar1;
  ulong uVar2;
  string *in_RCX;
  int *in_RDX;
  string *in_RDI;
  char *in_R8;
  bool *in_R9;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd80;
  char **in_stack_fffffffffffffd88;
  char **in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  bool *in_stack_fffffffffffffda8;
  bool *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdbc;
  string *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  bool *in_stack_fffffffffffffde0;
  LightSampler *in_stack_fffffffffffffde8;
  stringstream local_210 [16];
  undefined1 local_200 [8];
  char *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  LogLevel in_stack_fffffffffffffe24;
  string local_88 [32];
  undefined4 local_68;
  undefined1 local_53;
  byte local_52;
  byte local_51;
  string local_50 [8];
  LightSampler *in_stack_ffffffffffffffb8;
  bool *in_stack_ffffffffffffffc0;
  bool *in_stack_ffffffffffffffc8;
  
  copyToFormatString(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  lVar1 = std::__cxx11::string::find((char)local_50,0x2a);
  local_51 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_50,0x73);
  local_52 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_50,100);
  local_53 = lVar1 != -1;
  if ((local_51 & 1) == 0) {
    if ((bool)local_53) {
      uVar2 = std::__cxx11::string::find((char)local_50,100);
      IntegerFormatTrait<int>::fmt();
      std::__cxx11::string::replace((ulong)local_50,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
      std::__cxx11::string::operator+=(in_RDI,local_88);
      std::__cxx11::string::~string(local_88);
    }
    else if ((local_52 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                 in_stack_fffffffffffffe08);
      }
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd88);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_210);
      std::ostream::operator<<(local_200,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffdd0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
      std::__cxx11::stringstream::~stringstream(local_210);
    }
    stringPrintfRecursive<bool_const&,bool_const&,bool_const&,pbrt::LightSampler_const&>
              (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    local_68 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,bool_const&,pbrt::LightSampler_const&>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               in_stack_fffffffffffffde0,in_stack_fffffffffffffde8);
    local_68 = 1;
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}